

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O2

void deqp::gles3::Functional::anon_unknown_0::logShader
               (TestLog *log,RenderContext *renderCtx,Shader *shader)

{
  deUint32 dVar1;
  int iVar2;
  deUint32 err;
  qpShaderType type;
  undefined4 extraout_var;
  size_t __n;
  void *__buf;
  int infoLogLen;
  int sourceLen;
  vector<char,_std::allocator<char>_> source;
  int unusedLen;
  int compileStatus;
  ShaderInfo info;
  int local_100;
  int local_fc;
  _Vector_base<char,_std::allocator<char>_> local_f8;
  undefined1 local_e0 [4];
  int local_dc;
  LogShader local_d8;
  ShaderInfo local_88;
  long lVar3;
  
  local_88.source._M_dataplus._M_p = (pointer)&local_88.source.field_2;
  local_88.source._M_string_length = 0;
  local_88.source.field_2._M_local_buf[0] = '\0';
  local_88.infoLog._M_dataplus._M_p = (pointer)&local_88.infoLog.field_2;
  local_88.infoLog._M_string_length = 0;
  local_88.infoLog.field_2._M_local_buf[0] = '\0';
  local_88.compileOk = false;
  local_88.compileTimeUs = 0;
  dVar1 = shader->m_shader;
  iVar2 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  lVar3 = CONCAT44(extraout_var,iVar2);
  local_88.compileOk = false;
  local_88.compileTimeUs = 0;
  local_88.infoLog._M_string_length = 0;
  *local_88.infoLog._M_dataplus._M_p = '\0';
  local_dc = 0;
  local_fc = 0;
  local_100 = 0;
  (**(code **)(lVar3 + 0xa70))(dVar1,0x8b81);
  (**(code **)(lVar3 + 0xa70))(dVar1,0x8b88,&local_fc);
  (**(code **)(lVar3 + 0xa70))(dVar1,0x8b84,&local_100);
  err = (**(code **)(lVar3 + 0x800))();
  glu::checkError(err,"glGetShaderiv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderApiTests.cpp"
                  ,0xa6);
  local_88.compileOk = local_dc != 0;
  if (0 < (long)local_fc) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_f8,(long)local_fc,
               (allocator_type *)&local_d8);
    (**(code **)(lVar3 + 0xa68))
              (dVar1,(int)local_f8._M_impl.super__Vector_impl_data._M_finish -
                     (int)local_f8._M_impl.super__Vector_impl_data._M_start,local_e0);
    local_d8._0_8_ = (long)&local_d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,local_f8._M_impl.super__Vector_impl_data._M_start,
               local_f8._M_impl.super__Vector_impl_data._M_start + local_fc);
    std::__cxx11::string::operator=((string *)&local_88.source,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_f8);
  }
  if (0 < (long)local_100) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_f8,(long)local_100,
               (allocator_type *)&local_d8);
    (**(code **)(lVar3 + 0xa58))
              (dVar1,(int)local_f8._M_impl.super__Vector_impl_data._M_finish -
                     (int)local_f8._M_impl.super__Vector_impl_data._M_start,local_e0);
    local_d8._0_8_ = (long)&local_d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,local_f8._M_impl.super__Vector_impl_data._M_start,
               local_f8._M_impl.super__Vector_impl_data._M_start + local_100);
    std::__cxx11::string::operator=((string *)&local_88.infoLog,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_f8);
  }
  type = glu::getLogShaderType((shader->m_info).type);
  __n = (size_t)local_88.compileOk;
  tcu::LogShader::LogShader(&local_d8,type,&local_88.source,local_88.compileOk,&local_88.infoLog);
  tcu::LogShader::write(&local_d8,(int)log,__buf,__n);
  tcu::LogShader::~LogShader(&local_d8);
  glu::ShaderInfo::~ShaderInfo(&local_88);
  return;
}

Assistant:

void logShader (TestLog& log, glu::RenderContext& renderCtx, glu::Shader& shader)
{
	glu::ShaderInfo info;

	queryShaderInfo(renderCtx, shader.getShader(), info);

	log << TestLog::Shader(getLogShaderType(shader.getType()), info.source, info.compileOk, info.infoLog);
}